

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

int __thiscall
MutableS2ShapeIndex::Add
          (MutableS2ShapeIndex *this,unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *shape)

{
  int iVar1;
  
  iVar1 = (int)((ulong)((long)(this->shapes_).
                              super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->shapes_).
                             super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  ((shape->_M_t).super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t.
   super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
   super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl)->id_ = iVar1;
  std::
  vector<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>,std::allocator<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>>
  ::emplace_back<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>
            ((vector<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>,std::allocator<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>>
              *)&this->shapes_,shape);
  (this->index_status_)._M_i = STALE;
  return iVar1;
}

Assistant:

int MutableS2ShapeIndex::Add(unique_ptr<S2Shape> shape) {
  // Additions are processed lazily by ApplyUpdates().
  const int id = shapes_.size();
  shape->id_ = id;
  shapes_.push_back(std::move(shape));
  index_status_.store(STALE, std::memory_order_relaxed);
  return id;
}